

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

int __thiscall ncnn::Gemm_x86_avx::create_pipeline_int8(Gemm_x86_avx *this,Option *opt)

{
  Mat *A;
  undefined1 auVar1 [16];
  void *pvVar2;
  Allocator *pAVar3;
  size_t sVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  int *piVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined1 *puVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  undefined8 *puVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong local_1b0;
  int TILE_K;
  long local_198;
  undefined8 local_190;
  long local_188;
  undefined8 local_180;
  int local_174;
  ulong local_170;
  undefined8 local_168;
  long local_160;
  ulong local_158;
  Gemm_x86_avx *local_150;
  uint local_144;
  int TILE_N;
  int TILE_M;
  Option *local_138;
  Mat *local_130;
  undefined1 local_128 [44];
  int iStack_fc;
  undefined8 uStack_f8;
  int local_f0;
  size_t local_e8;
  uint local_dc;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ulong local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_150 = this;
  local_138 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_0050dad5:
    if ((this->super_Gemm).constantB != 0) {
      uVar9 = (this->super_Gemm).constantN;
      iVar16 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar9,iVar16,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,local_138->num_threads);
      local_dc = (int)(uVar9 + TILE_N + -1) / TILE_N;
      local_90 = (ulong)uVar9;
      Mat::create(&this->BT_data,TILE_N * TILE_K,(TILE_K + iVar16 + -1) / TILE_K,local_dc,1,
                  (Allocator *)0x0);
      if ((this->BT_data).data == (void *)0x0) {
        bVar42 = true;
      }
      else {
        bVar42 = (long)(this->BT_data).c * (this->BT_data).cstep == 0;
      }
      if (bVar42) goto LAB_0050dbb8;
      if (0 < (int)local_dc) {
        local_130 = &(this->super_Gemm).B_data;
        local_d8 = 0;
        do {
          if (0 < iVar16) {
            iVar36 = TILE_N * (int)local_d8;
            uVar9 = (int)local_90 - iVar36;
            lVar10 = (long)iVar36;
            local_70 = lVar10 + 7;
            local_78 = lVar10 + 6;
            local_80 = lVar10 + 5;
            local_88 = lVar10 + 4;
            local_b0 = lVar10 + 3;
            local_b8 = lVar10 + 2;
            local_c0 = lVar10 + 1;
            iVar19 = 0;
            local_174 = iVar36;
            do {
              uVar7 = uVar9;
              if (TILE_N < (int)uVar9) {
                uVar7 = TILE_N;
              }
              local_144 = iVar16 - iVar19;
              local_d0 = (ulong)TILE_K;
              uVar5 = local_144;
              if (TILE_K < (int)local_144) {
                uVar5 = TILE_K;
              }
              local_128._16_8_ = (this->BT_data).elemsize;
              iStack_fc = (this->BT_data).w;
              local_e8 = (size_t)iStack_fc;
              local_128._24_4_ = (this->BT_data).elempack;
              local_128._32_8_ = (this->BT_data).allocator;
              local_128._0_8_ =
                   (long)(this->BT_data).data +
                   local_128._16_8_ * local_e8 * (long)(iVar19 / TILE_K) +
                   (long)(iVar36 / TILE_N) * (this->BT_data).cstep * local_128._16_8_;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._40_4_ = 2;
              uStack_f8 = 0x100000001;
              local_f0 = 1;
              local_180 = CONCAT44(local_180._4_4_,iVar19);
              if ((this->super_Gemm).transB == 0) {
                iVar8 = cpu_support_x86_avx_vnni_int8();
                if (iVar8 == 0) {
                  iVar8 = cpu_support_x86_avx_vnni();
                  if (iVar8 == 0) {
                    iVar8 = cpu_support_x86_avx2();
                    if (iVar8 == 0) {
                      iVar8 = (this->super_Gemm).B_data.w;
                      lVar33 = (long)iVar8;
                      uVar15 = 0;
                      pauVar13 = (undefined1 (*) [16])local_128._0_8_;
                      iVar17 = iVar19;
                      if (7 < (int)uVar7) {
                        lVar18 = lVar10 + lVar33;
                        lVar26 = lVar10;
                        uVar29 = 0;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar37 = (long)(this->super_Gemm).B_data.w * (long)iVar19 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar5 < 2) {
                            lVar24 = (long)pvVar2 + lVar10 + uVar29;
                            uVar31 = 0;
                          }
                          else {
                            lVar24 = (long)pvVar2 + lVar26;
                            lVar27 = (long)pvVar2 + lVar18;
                            iVar17 = 1;
                            do {
                              auVar43._8_8_ = 0;
                              auVar43._0_8_ = *(ulong *)(lVar24 + lVar37);
                              auVar44._8_8_ = 0;
                              auVar44._0_8_ = *(ulong *)(lVar27 + lVar37);
                              auVar43 = vpunpcklbw_avx(auVar43,auVar44);
                              *pauVar13 = auVar43;
                              pauVar13 = pauVar13 + 1;
                              lVar24 = lVar24 + iVar8 * 2;
                              lVar27 = lVar27 + iVar8 * 2;
                              iVar17 = iVar17 + 2;
                              uVar31 = uVar5 & 0xfffffffe;
                            } while (iVar17 < (int)uVar5);
                          }
                          puVar41 = (undefined8 *)(lVar24 + lVar37);
                          iVar17 = uVar5 - uVar31;
                          if (iVar17 != 0 && (int)uVar31 <= (int)uVar5) {
                            do {
                              *(undefined8 *)*pauVar13 = *puVar41;
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
                              puVar41 = (undefined8 *)((long)puVar41 + lVar33);
                              iVar17 = iVar17 + -1;
                            } while (iVar17 != 0);
                          }
                          uVar15 = uVar29 + 8;
                          uVar32 = uVar29 + 0xf;
                          lVar26 = lVar26 + 8;
                          lVar18 = lVar18 + 8;
                          uVar29 = uVar15;
                          iVar17 = (int)local_180;
                        } while (uVar32 < uVar7);
                      }
                      if ((int)((uint)uVar15 | 3) < (int)uVar7) {
                        local_158 = (ulong)iVar17;
                        lVar24 = (long)(iVar8 * 2);
                        local_190 = CONCAT44(local_190._4_4_,uVar5) & 0xfffffffffffffffe;
                        lVar18 = lVar10 + (uVar15 & 0xffffffff);
                        lVar28 = (iVar8 + 3) + lVar18;
                        lVar27 = (iVar8 + 2) + lVar18;
                        lVar37 = (iVar8 + 1) + lVar18;
                        lVar26 = lVar18 + lVar33;
                        uVar29 = uVar15 & 0xffffffff;
                        do {
                          pvVar2 = (local_150->super_Gemm).B_data.data;
                          lVar35 = (long)(local_150->super_Gemm).B_data.w * local_158 *
                                   (local_150->super_Gemm).B_data.elemsize;
                          if ((int)uVar5 < 2) {
                            lVar40 = (long)pvVar2 + lVar10 + uVar29;
                            uVar31 = 0;
                          }
                          else {
                            lVar40 = lVar18 + (long)pvVar2;
                            lVar39 = lVar28 + (long)pvVar2;
                            lVar14 = lVar27 + (long)pvVar2;
                            lVar22 = lVar37 + (long)pvVar2;
                            lVar23 = (long)pvVar2 + lVar26;
                            iVar36 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar40 + lVar35);
                              (*pauVar13)[1] = *(undefined1 *)(lVar23 + lVar35);
                              (*pauVar13)[2] = *(undefined1 *)(lVar40 + 1 + lVar35);
                              (*pauVar13)[3] = *(undefined1 *)(lVar22 + lVar35);
                              (*pauVar13)[4] = *(undefined1 *)(lVar40 + 2 + lVar35);
                              (*pauVar13)[5] = *(undefined1 *)(lVar14 + lVar35);
                              (*pauVar13)[6] = *(undefined1 *)(lVar40 + 3 + lVar35);
                              (*pauVar13)[7] = *(undefined1 *)(lVar39 + lVar35);
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
                              iVar36 = iVar36 + 2;
                              lVar40 = lVar40 + lVar24;
                              lVar39 = lVar39 + lVar24;
                              lVar14 = lVar14 + lVar24;
                              lVar22 = lVar22 + lVar24;
                              lVar23 = lVar23 + lVar24;
                            } while (iVar36 < (int)uVar5);
                            uVar31 = uVar5 & 0xfffffffe;
                            local_198 = lVar27;
                            local_188 = lVar28;
                          }
                          iVar36 = uVar5 - uVar31;
                          if (iVar36 != 0 && (int)uVar31 <= (int)uVar5) {
                            puVar25 = (undefined1 *)(lVar40 + lVar35 + 3);
                            do {
                              (*pauVar13)[0] = puVar25[-3];
                              (*pauVar13)[1] = puVar25[-2];
                              (*pauVar13)[2] = puVar25[-1];
                              (*pauVar13)[3] = *puVar25;
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
                              puVar25 = puVar25 + lVar33;
                              iVar36 = iVar36 + -1;
                            } while (iVar36 != 0);
                          }
                          uVar15 = uVar29 + 4;
                          lVar35 = uVar29 + 7;
                          lVar18 = lVar18 + 4;
                          lVar28 = lVar28 + 4;
                          lVar27 = lVar27 + 4;
                          lVar37 = lVar37 + 4;
                          lVar26 = lVar26 + 4;
                          this = local_150;
                          uVar29 = uVar15;
                          iVar36 = local_174;
                          iVar17 = (int)local_180;
                        } while (lVar35 < (int)uVar7);
                      }
                      iVar19 = iVar17;
                      if ((int)((uint)uVar15 | 1) < (int)uVar7) {
                        lVar24 = (long)(iVar8 * 2);
                        lVar18 = lVar10 + (uVar15 & 0xffffffff);
                        lVar37 = (iVar8 + 1) + lVar18;
                        lVar26 = lVar18 + lVar33;
                        uVar29 = uVar15 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).B_data.data;
                          lVar27 = (long)(this->super_Gemm).B_data.w * (long)iVar17 *
                                   (this->super_Gemm).B_data.elemsize;
                          if ((int)uVar5 < 2) {
                            lVar28 = (long)pvVar2 + lVar10 + uVar29;
                            uVar31 = 0;
                          }
                          else {
                            lVar28 = (long)pvVar2 + lVar18;
                            lVar35 = (long)pvVar2 + lVar37;
                            lVar40 = (long)pvVar2 + lVar26;
                            iVar19 = 1;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar28 + lVar27);
                              (*pauVar13)[1] = *(undefined1 *)(lVar40 + lVar27);
                              (*pauVar13)[2] = *(undefined1 *)(lVar28 + 1 + lVar27);
                              (*pauVar13)[3] = *(undefined1 *)(lVar35 + lVar27);
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
                              iVar19 = iVar19 + 2;
                              lVar28 = lVar28 + lVar24;
                              lVar35 = lVar35 + lVar24;
                              lVar40 = lVar40 + lVar24;
                              iVar36 = local_174;
                              uVar31 = uVar5 & 0xfffffffe;
                            } while (iVar19 < (int)uVar5);
                          }
                          iVar19 = uVar5 - uVar31;
                          if (iVar19 != 0 && (int)uVar31 <= (int)uVar5) {
                            puVar25 = (undefined1 *)(lVar28 + lVar27 + 1);
                            do {
                              (*pauVar13)[0] = puVar25[-1];
                              (*pauVar13)[1] = *puVar25;
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 2);
                              puVar25 = puVar25 + lVar33;
                              iVar19 = iVar19 + -1;
                            } while (iVar19 != 0);
                          }
                          uVar15 = uVar29 + 2;
                          lVar27 = uVar29 + 3;
                          lVar18 = lVar18 + 2;
                          lVar37 = lVar37 + 2;
                          lVar26 = lVar26 + 2;
                          uVar29 = uVar15;
                          this = local_150;
                          iVar19 = (int)local_180;
                        } while (lVar27 < (int)uVar7);
                      }
                      if ((int)uVar15 < (int)uVar7) {
                        lVar18 = (long)(int)uVar15;
                        do {
                          if (0 < (int)uVar5) {
                            puVar25 = (undefined1 *)
                                      ((long)(this->super_Gemm).B_data.data +
                                      lVar10 + lVar18 +
                                      (long)(this->super_Gemm).B_data.w * (long)iVar19 *
                                      (this->super_Gemm).B_data.elemsize);
                            uVar31 = uVar5;
                            do {
                              (*pauVar13)[0] = *puVar25;
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 1);
                              puVar25 = puVar25 + lVar33;
                              uVar31 = uVar31 - 1;
                            } while (uVar31 != 0);
                          }
                          lVar18 = lVar18 + 1;
                        } while (lVar18 != (int)uVar7);
                      }
                    }
                    else {
                      transpose_pack_B_tile_int8_avx2
                                (local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5);
                    }
                  }
                  else {
                    transpose_pack_B_tile_int8_avxvnni
                              (local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5);
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avxvnniint8
                            (local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5);
                }
              }
              else {
                iVar8 = cpu_support_x86_avx_vnni_int8();
                if (iVar8 == 0) {
                  iVar8 = cpu_support_x86_avx_vnni();
                  if (iVar8 == 0) {
                    iVar8 = cpu_support_x86_avx2();
                    if (iVar8 == 0) {
                      uVar15 = 0;
                      lVar33 = (long)iVar19;
                      pauVar13 = (undefined1 (*) [16])local_128._0_8_;
                      if (7 < (int)uVar7) {
                        local_c4 = uVar5 & 0xfffffffe;
                        local_38 = (ulong)uVar7;
                        local_98 = local_88;
                        local_a0 = local_80;
                        local_a8 = local_70;
                        local_1b0 = 0;
                        uVar29 = local_78;
                        uVar32 = local_b0;
                        lVar18 = local_c0;
                        lVar26 = local_b8;
                        lVar37 = lVar10;
                        do {
                          local_198 = lVar37;
                          local_188 = lVar26;
                          local_158 = uVar32;
                          local_190 = uVar29;
                          lVar26 = (long)(this->super_Gemm).B_data.w;
                          sVar4 = (this->super_Gemm).B_data.elemsize;
                          lVar37 = (long)(this->super_Gemm).B_data.data + lVar33;
                          if ((int)uVar5 < 2) {
                            lVar26 = sVar4 * lVar26;
                            lVar27 = (local_1b0 + lVar10) * lVar26 + lVar37;
                            lVar40 = (local_1b0 + lVar10 + 1) * lVar26 + lVar37;
                            lVar28 = (local_1b0 + lVar10 + 2) * lVar26 + lVar37;
                            lVar35 = (local_1b0 + lVar10 + 3) * lVar26 + lVar37;
                            lVar24 = (local_1b0 + lVar10 + 4) * lVar26 + lVar37;
                            local_160 = (local_1b0 + lVar10 + 5) * lVar26 + lVar37;
                            local_168 = (local_1b0 + lVar10 + 6) * lVar26 + lVar37;
                            local_170 = (lVar10 + local_1b0 + 7) * lVar26 + lVar37;
                            uVar31 = 0;
                          }
                          else {
                            lVar22 = sVar4 * local_a8 * lVar26;
                            lVar24 = lVar37 + lVar22;
                            lVar23 = sVar4 * local_190 * lVar26;
                            lVar28 = lVar37 + lVar23;
                            local_160 = sVar4 * local_a0 * lVar26;
                            lVar40 = lVar37 + local_160;
                            local_58 = sVar4 * local_98 * lVar26;
                            lVar35 = sVar4 * local_158 * lVar26;
                            lVar14 = lVar37 + lVar35;
                            local_50 = sVar4 * local_188 * lVar26;
                            local_48 = sVar4 * lVar18 * lVar26;
                            local_68 = sVar4 * local_198 * lVar26;
                            lVar26 = 0;
                            pauVar6 = pauVar13;
                            do {
                              pauVar11 = pauVar6;
                              puVar25 = *pauVar13 + lVar26 * 8;
                              *puVar25 = *(undefined1 *)(lVar37 + local_68 + lVar26);
                              puVar25[1] = *(undefined1 *)(lVar37 + local_68 + 1 + lVar26);
                              puVar25[2] = *(undefined1 *)(local_48 + lVar37 + lVar26);
                              puVar25[3] = *(undefined1 *)(local_48 + lVar37 + 1 + lVar26);
                              puVar25[4] = *(undefined1 *)(lVar37 + local_50 + lVar26);
                              puVar25[5] = *(undefined1 *)(lVar37 + local_50 + 1 + lVar26);
                              puVar25[6] = *(undefined1 *)(lVar14 + lVar26);
                              puVar25[7] = *(undefined1 *)(lVar14 + 1 + lVar26);
                              puVar25[8] = *(undefined1 *)(lVar37 + local_58 + lVar26);
                              puVar25[9] = *(undefined1 *)(lVar37 + local_58 + 1 + lVar26);
                              puVar25[10] = *(undefined1 *)(lVar40 + lVar26);
                              puVar25[0xb] = *(undefined1 *)(lVar40 + 1 + lVar26);
                              puVar25[0xc] = *(undefined1 *)(lVar28 + lVar26);
                              puVar25[0xd] = *(undefined1 *)(lVar28 + 1 + lVar26);
                              puVar25[0xe] = *(undefined1 *)(lVar24 + lVar26);
                              puVar25[0xf] = *(undefined1 *)(lVar24 + 1 + lVar26);
                              lVar27 = lVar26 + 2;
                              iVar36 = (int)lVar26;
                              lVar26 = lVar27;
                              pauVar6 = (undefined1 (*) [16])(puVar25 + 0x10);
                            } while (iVar36 + 3 < (int)uVar5);
                            pauVar13 = pauVar11 + 1;
                            lVar27 = lVar37 + lVar27;
                            local_170 = lVar22 + lVar27;
                            local_168 = lVar23 + lVar27;
                            local_160 = local_160 + lVar27;
                            lVar24 = local_58 + lVar27;
                            lVar35 = lVar35 + lVar27;
                            lVar28 = local_50 + lVar27;
                            lVar40 = local_48 + lVar27;
                            lVar27 = lVar27 + local_68;
                            this = local_150;
                            uVar31 = local_c4;
                            local_60 = lVar37;
                            local_40 = lVar18;
                          }
                          if ((int)uVar31 < (int)uVar5) {
                            lVar26 = 0;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)(lVar27 + lVar26);
                              (*pauVar13)[1] = *(undefined1 *)(lVar40 + lVar26);
                              (*pauVar13)[2] = *(undefined1 *)(lVar28 + lVar26);
                              (*pauVar13)[3] = *(undefined1 *)(lVar35 + lVar26);
                              (*pauVar13)[4] = *(undefined1 *)(lVar24 + lVar26);
                              (*pauVar13)[5] = *(undefined1 *)(local_160 + lVar26);
                              (*pauVar13)[6] = *(undefined1 *)(local_168 + lVar26);
                              (*pauVar13)[7] = *(undefined1 *)(local_170 + lVar26);
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
                              lVar26 = lVar26 + 1;
                            } while (uVar5 - uVar31 != (int)lVar26);
                          }
                          uVar15 = local_1b0 + 8;
                          uVar38 = local_1b0 + 0xf;
                          local_a8 = local_a8 + 8;
                          local_a0 = local_a0 + 8;
                          local_98 = local_98 + 8;
                          lVar18 = lVar18 + 8;
                          uVar29 = local_190 + 8;
                          uVar32 = local_158 + 8;
                          lVar26 = local_188 + 8;
                          lVar37 = local_198 + 8;
                          iVar36 = local_174;
                          iVar19 = (int)local_180;
                          local_1b0 = uVar15;
                        } while (uVar38 < local_38);
                      }
                      lVar18 = (long)(int)uVar7;
                      if ((int)((uint)uVar15 | 3) < (int)uVar7) {
                        local_168 = CONCAT44(local_168._4_4_,uVar5) & 0xfffffffffffffffe;
                        local_1b0 = uVar15 & 0xffffffff;
                        lVar26 = local_b0 + local_1b0;
                        uVar29 = local_b8 + local_1b0;
                        uVar32 = local_c0 + local_1b0;
                        lVar37 = lVar10 + local_1b0;
                        do {
                          lVar24 = (long)(this->super_Gemm).B_data.w;
                          sVar4 = (this->super_Gemm).B_data.elemsize;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          if ((int)uVar5 < 2) {
                            lVar24 = sVar4 * lVar24;
                            lVar27 = (local_1b0 + lVar10) * lVar24 + lVar33;
                            lVar28 = (local_1b0 + lVar10 + 1) * lVar24 + lVar33;
                            lVar35 = (local_1b0 + lVar10 + 2) * lVar24 + lVar33;
                            lVar40 = (local_1b0 + lVar10 + 3) * lVar24 + lVar33;
                            iVar36 = 0;
                          }
                          else {
                            lVar40 = sVar4 * lVar26 * lVar24;
                            lVar14 = lVar40 + lVar33;
                            lVar35 = sVar4 * uVar29 * lVar24;
                            lVar22 = lVar35 + lVar33;
                            lVar28 = sVar4 * uVar32 * lVar24;
                            lVar23 = lVar28 + lVar33;
                            lVar24 = sVar4 * lVar37 * lVar24;
                            lVar39 = lVar24 + lVar33;
                            pauVar6 = pauVar13;
                            lVar21 = 0;
                            do {
                              pauVar11 = pauVar6;
                              puVar25 = *pauVar13 + lVar21 * 4;
                              *puVar25 = *(undefined1 *)((long)pvVar2 + lVar21 + lVar39);
                              puVar25[1] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar39 + 1);
                              puVar25[2] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar23);
                              puVar25[3] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar23 + 1);
                              puVar25[4] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar22);
                              puVar25[5] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar22 + 1);
                              puVar25[6] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar14);
                              puVar25[7] = *(undefined1 *)((long)pvVar2 + lVar21 + lVar14 + 1);
                              lVar27 = lVar21 + 2;
                              iVar36 = (int)lVar21;
                              pauVar6 = (undefined1 (*) [16])(puVar25 + 8);
                              lVar21 = lVar27;
                            } while (iVar36 + 3 < (int)uVar5);
                            pauVar13 = (undefined1 (*) [16])(*pauVar11 + 8);
                            lVar27 = lVar27 + lVar33;
                            lVar40 = lVar40 + lVar27;
                            lVar35 = lVar35 + lVar27;
                            lVar28 = lVar28 + lVar27;
                            lVar27 = lVar24 + lVar27;
                            iVar36 = (int)local_168;
                            local_190 = uVar32;
                            local_188 = lVar26;
                            local_160 = lVar37;
                            local_158 = uVar29;
                          }
                          if (iVar36 < (int)uVar5) {
                            lVar24 = 0;
                            do {
                              (*pauVar13)[0] = *(undefined1 *)((long)pvVar2 + lVar24 + lVar27);
                              (*pauVar13)[1] = *(undefined1 *)((long)pvVar2 + lVar24 + lVar28);
                              (*pauVar13)[2] = *(undefined1 *)((long)pvVar2 + lVar24 + lVar35);
                              (*pauVar13)[3] = *(undefined1 *)((long)pvVar2 + lVar24 + lVar40);
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
                              lVar24 = lVar24 + 1;
                            } while (uVar5 - iVar36 != (int)lVar24);
                          }
                          uVar15 = local_1b0 + 4;
                          lVar24 = local_1b0 + 7;
                          lVar26 = lVar26 + 4;
                          uVar29 = uVar29 + 4;
                          uVar32 = uVar32 + 4;
                          lVar37 = lVar37 + 4;
                          this = local_150;
                          iVar36 = local_174;
                          iVar19 = (int)local_180;
                          local_1b0 = uVar15;
                          local_198 = lVar18;
                        } while (lVar24 < lVar18);
                      }
                      if ((int)((uint)uVar15 | 1) < (int)uVar7) {
                        uVar29 = uVar15 & 0xffffffff;
                        do {
                          lVar26 = (long)(this->super_Gemm).B_data.w *
                                   (this->super_Gemm).B_data.elemsize;
                          pvVar2 = (this->super_Gemm).B_data.data;
                          puVar25 = (undefined1 *)
                                    ((long)pvVar2 + (uVar29 + lVar10) * lVar26 + lVar33);
                          puVar30 = (undefined1 *)
                                    ((long)pvVar2 + (lVar10 + uVar29 + 1) * lVar26 + lVar33);
                          uVar31 = 0;
                          if (1 < (int)uVar5) {
                            iVar8 = 1;
                            do {
                              (*pauVar13)[0] = *puVar25;
                              (*pauVar13)[1] = puVar25[1];
                              (*pauVar13)[2] = *puVar30;
                              (*pauVar13)[3] = puVar30[1];
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 4);
                              puVar25 = puVar25 + 2;
                              puVar30 = puVar30 + 2;
                              iVar8 = iVar8 + 2;
                              uVar31 = uVar5 & 0xfffffffe;
                            } while (iVar8 < (int)uVar5);
                          }
                          if ((int)uVar31 < (int)uVar5) {
                            lVar26 = 0;
                            do {
                              (*pauVar13)[0] = puVar25[lVar26];
                              (*pauVar13)[1] = puVar30[lVar26];
                              pauVar13 = (undefined1 (*) [16])(*pauVar13 + 2);
                              lVar26 = lVar26 + 1;
                            } while (uVar5 - uVar31 != (int)lVar26);
                          }
                          uVar15 = uVar29 + 2;
                          lVar26 = uVar29 + 3;
                          uVar29 = uVar15;
                        } while (lVar26 < lVar18);
                      }
                      if ((int)uVar15 < (int)uVar7) {
                        lVar26 = (long)(int)uVar15;
                        uVar15 = (long)(int)local_144;
                        if ((long)local_d0 < (long)(int)local_144) {
                          uVar15 = local_d0;
                        }
                        lVar37 = lVar10 + lVar26;
                        do {
                          if (0 < (int)uVar5) {
                            iVar8 = (this->super_Gemm).B_data.w;
                            pvVar2 = (this->super_Gemm).B_data.data;
                            sVar4 = (this->super_Gemm).B_data.elemsize;
                            lVar24 = 0;
                            do {
                              (*pauVar13)[lVar24] =
                                   *(undefined1 *)
                                    ((long)pvVar2 + lVar24 + sVar4 * lVar37 * (long)iVar8 + lVar33);
                              lVar24 = lVar24 + 1;
                            } while ((int)uVar15 != (int)lVar24);
                            pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar24);
                          }
                          lVar26 = lVar26 + 1;
                          lVar37 = lVar37 + 1;
                        } while (lVar26 != lVar18);
                      }
                    }
                    else {
                      pack_B_tile_int8_avx2(local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5);
                    }
                  }
                  else {
                    pack_B_tile_int8_avxvnni(local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5);
                  }
                }
                else {
                  pack_B_tile_int8_avxvnniint8(local_130,(Mat *)local_128,iVar36,uVar7,iVar19,uVar5)
                  ;
                }
              }
              piVar12 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + -1;
                UNLOCK();
                if (*piVar12 == 0) {
                  if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
                    if ((undefined1 (*) [16])local_128._0_8_ != (undefined1 (*) [16])0x0) {
                      free((void *)local_128._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_128._32_8_)[3])();
                  }
                }
              }
              local_e8 = 0;
              local_128._0_8_ = (void *)0x0;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._16_8_ = 0;
              local_128._24_4_ = 0;
              stack0xffffffffffffff00 = (undefined1  [16])0x0;
              local_f0 = 0;
              iVar19 = iVar19 + TILE_K;
            } while (iVar19 < iVar16);
          }
          uVar9 = (int)local_d8 + 1;
          local_d8 = (ulong)uVar9;
        } while (uVar9 != local_dc);
      }
      if (local_138->lightmode != false) {
        piVar12 = (this->super_Gemm).B_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).B_data.data;
            pAVar3 = (this->super_Gemm).B_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
      if (bVar42) {
        return -100;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar12 = (this->super_Gemm).C_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (this->CT_data).refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pvVar2 = (this->CT_data).data;
          pAVar3 = (this->CT_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->CT_data).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->CT_data).refcount + 4) = (undefined1  [16])0x0;
      (this->CT_data).data = (void *)0x0;
      (this->CT_data).refcount = (int *)0x0;
      auVar1._0_8_ = (this->super_Gemm).C_data.data;
      auVar1._8_8_ = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (void *)auVar1._0_8_;
      (this->CT_data).refcount = (int *)auVar1._8_8_;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar16 = (this->super_Gemm).C_data.w;
      iVar36 = (this->super_Gemm).C_data.h;
      iVar19 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar16;
      (this->CT_data).h = iVar36;
      (this->CT_data).d = iVar19;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (local_138->lightmode == true) {
        piVar12 = (int *)vpextrq_avx(auVar1,1);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).C_data.data;
            pAVar3 = (this->super_Gemm).C_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar16 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = local_138->num_threads;
      iVar16 = 0;
    }
  }
  else {
    uVar9 = (this->super_Gemm).constantM;
    uVar7 = (this->super_Gemm).constantK;
    local_190 = (ulong)uVar7;
    get_optimal_tile_mnk_int8
              (uVar9,0,uVar7,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar36 = TILE_M;
    iVar16 = TILE_K;
    uVar7 = (int)(uVar9 + TILE_M + -1) / TILE_M;
    iVar19 = iVar16;
    local_d0 = (ulong)uVar9;
    if (3 < TILE_K) {
      iVar8 = cpu_support_x86_avx512_vnni();
      bVar42 = true;
      if (iVar8 == 0) {
        iVar8 = cpu_support_x86_avx_vnni();
        bVar42 = iVar8 != 0;
      }
      iVar8 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar42 ^ 1U | iVar8 != 0)) {
        iVar19 = 0x40;
        if (((iVar36 < 0x10) && (iVar19 = 0x20, iVar36 < 8)) && (iVar19 = 0x10, iVar36 < 4)) {
          iVar19 = (uint)(1 < iVar36) * 4 + 4;
        }
        iVar19 = iVar19 + iVar16;
      }
    }
    uVar15 = local_190;
    Mat::create(&this->AT_data,iVar19 * iVar36,((int)local_190 + iVar16 + -1) / iVar16,uVar7,1,
                (Allocator *)0x0);
    if ((this->AT_data).data == (void *)0x0) {
      bVar42 = true;
    }
    else {
      bVar42 = (long)(this->AT_data).c * (this->AT_data).cstep == 0;
    }
    if (!bVar42) {
      local_144 = local_144 & 0xffffff00;
      if (0 < (int)uVar7) {
        A = &(this->super_Gemm).A_data;
        local_170 = 0;
        do {
          if (0 < (int)uVar15) {
            iVar16 = TILE_M * (int)local_170;
            uVar9 = (int)local_d0 - iVar16;
            lVar10 = (long)iVar16;
            iVar36 = 0;
            local_198 = CONCAT44(local_198._4_4_,iVar16);
            do {
              uVar5 = uVar9;
              if (TILE_M < (int)uVar9) {
                uVar5 = TILE_M;
              }
              iVar19 = (int)uVar15 - iVar36;
              if (TILE_K < iVar19) {
                iVar19 = TILE_K;
              }
              local_128._16_8_ = (this->AT_data).elemsize;
              iStack_fc = (this->AT_data).w;
              local_e8 = (size_t)iStack_fc;
              local_128._24_4_ = (this->AT_data).elempack;
              local_128._32_8_ = (this->AT_data).allocator;
              local_128._0_8_ =
                   (long)(this->AT_data).data +
                   local_128._16_8_ * local_e8 * (long)(iVar36 / TILE_K) +
                   (long)(iVar16 / TILE_M) * (this->AT_data).cstep * local_128._16_8_;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._40_4_ = 2;
              uStack_f8 = 0x100000001;
              local_f0 = 1;
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(A,(Mat *)local_128,iVar16,uVar5,iVar36,iVar19);
              }
              else {
                iVar8 = cpu_support_x86_avx_vnni_int8();
                if (iVar8 == 0) {
                  iVar8 = cpu_support_x86_avx_vnni();
                  if (iVar8 == 0) {
                    iVar8 = cpu_support_x86_avx2();
                    if (iVar8 == 0) {
                      iVar8 = (this->super_Gemm).A_data.w;
                      lVar33 = (long)iVar8;
                      uVar29 = 0;
                      puVar25 = (undefined1 *)local_128._0_8_;
                      if (3 < (int)uVar5) {
                        local_160 = (long)iVar36;
                        lVar24 = (long)(iVar8 * 2);
                        local_168 = CONCAT44(local_168._4_4_,iVar19) & 0xfffffffffffffffe;
                        local_158 = (ulong)uVar5;
                        local_188 = (iVar8 + 3) + lVar10;
                        lVar37 = (iVar8 + 1) + lVar10;
                        lVar18 = lVar10 + lVar33;
                        lVar26 = lVar10;
                        uVar32 = (iVar8 + 2) + lVar10;
                        uVar38 = 0;
                        do {
                          local_180 = uVar32;
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar27 = (this->super_Gemm).A_data.w * local_160 *
                                   (this->super_Gemm).A_data.elemsize;
                          if (iVar19 < 2) {
                            lVar28 = (long)pvVar2 + lVar10 + uVar38;
                            iVar17 = 0;
                          }
                          else {
                            lVar28 = (long)pvVar2 + lVar26;
                            lVar35 = (long)pvVar2 + local_188;
                            lVar40 = (long)pvVar2 + local_180;
                            lVar14 = (long)pvVar2 + lVar37;
                            lVar22 = (long)pvVar2 + lVar18;
                            iVar16 = 1;
                            do {
                              *puVar25 = *(undefined1 *)(lVar28 + lVar27);
                              puVar25[1] = *(undefined1 *)(lVar22 + lVar27);
                              puVar25[2] = *(undefined1 *)(lVar28 + 1 + lVar27);
                              puVar25[3] = *(undefined1 *)(lVar14 + lVar27);
                              puVar25[4] = *(undefined1 *)(lVar28 + 2 + lVar27);
                              puVar25[5] = *(undefined1 *)(lVar40 + lVar27);
                              puVar25[6] = *(undefined1 *)(lVar28 + 3 + lVar27);
                              puVar25[7] = *(undefined1 *)(lVar35 + lVar27);
                              puVar25 = puVar25 + 8;
                              iVar16 = iVar16 + 2;
                              lVar28 = lVar28 + lVar24;
                              lVar35 = lVar35 + lVar24;
                              lVar40 = lVar40 + lVar24;
                              lVar14 = lVar14 + lVar24;
                              lVar22 = lVar22 + lVar24;
                            } while (iVar16 < iVar19);
                            uVar15 = local_190;
                            this = local_150;
                            iVar17 = (int)local_168;
                            iVar16 = (int)local_198;
                          }
                          iVar20 = iVar19 - iVar17;
                          if (iVar20 != 0 && iVar17 <= iVar19) {
                            puVar30 = (undefined1 *)(lVar28 + lVar27 + 3);
                            do {
                              *puVar25 = puVar30[-3];
                              puVar25[1] = puVar30[-2];
                              puVar25[2] = puVar30[-1];
                              puVar25[3] = *puVar30;
                              puVar25 = puVar25 + 4;
                              puVar30 = puVar30 + lVar33;
                              iVar20 = iVar20 + -1;
                            } while (iVar20 != 0);
                          }
                          uVar29 = uVar38 + 4;
                          uVar34 = uVar38 + 7;
                          lVar26 = lVar26 + 4;
                          local_188 = local_188 + 4;
                          lVar37 = lVar37 + 4;
                          lVar18 = lVar18 + 4;
                          uVar32 = local_180 + 4;
                          uVar38 = uVar29;
                        } while (uVar34 < local_158);
                      }
                      if ((int)((uint)uVar29 | 1) < (int)uVar5) {
                        lVar24 = (long)(iVar8 * 2);
                        local_180 = CONCAT44(local_180._4_4_,iVar19) & 0xfffffffffffffffe;
                        lVar18 = lVar10 + (uVar29 & 0xffffffff);
                        lVar37 = (iVar8 + 1) + lVar18;
                        lVar26 = lVar18 + lVar33;
                        uVar32 = uVar29 & 0xffffffff;
                        do {
                          pvVar2 = (this->super_Gemm).A_data.data;
                          lVar27 = (long)(this->super_Gemm).A_data.w * (long)iVar36 *
                                   (this->super_Gemm).A_data.elemsize;
                          if (iVar19 < 2) {
                            lVar28 = (long)pvVar2 + lVar10 + uVar32;
                            iVar16 = 0;
                          }
                          else {
                            lVar28 = (long)pvVar2 + lVar18;
                            lVar35 = (long)pvVar2 + lVar37;
                            lVar40 = (long)pvVar2 + lVar26;
                            iVar16 = 1;
                            do {
                              *puVar25 = *(undefined1 *)(lVar28 + lVar27);
                              puVar25[1] = *(undefined1 *)(lVar40 + lVar27);
                              puVar25[2] = *(undefined1 *)(lVar28 + 1 + lVar27);
                              puVar25[3] = *(undefined1 *)(lVar35 + lVar27);
                              puVar25 = puVar25 + 4;
                              iVar16 = iVar16 + 2;
                              lVar28 = lVar28 + lVar24;
                              lVar35 = lVar35 + lVar24;
                              lVar40 = lVar40 + lVar24;
                            } while (iVar16 < iVar19);
                            this = local_150;
                            iVar16 = (int)local_180;
                          }
                          iVar8 = iVar19 - iVar16;
                          if (iVar8 != 0 && iVar16 <= iVar19) {
                            puVar30 = (undefined1 *)(lVar28 + lVar27 + 1);
                            do {
                              *puVar25 = puVar30[-1];
                              puVar25[1] = *puVar30;
                              puVar25 = puVar25 + 2;
                              puVar30 = puVar30 + lVar33;
                              iVar8 = iVar8 + -1;
                            } while (iVar8 != 0);
                          }
                          uVar29 = uVar32 + 2;
                          lVar27 = uVar32 + 3;
                          lVar18 = lVar18 + 2;
                          lVar37 = lVar37 + 2;
                          lVar26 = lVar26 + 2;
                          uVar15 = local_190;
                          uVar32 = uVar29;
                          iVar16 = (int)local_198;
                        } while (lVar27 < (int)uVar5);
                      }
                      if ((int)uVar29 < (int)uVar5) {
                        uVar29 = uVar29 & 0xffffffff;
                        do {
                          if (0 < iVar19) {
                            puVar30 = (undefined1 *)
                                      ((long)(this->super_Gemm).A_data.data +
                                      lVar10 + uVar29 +
                                      (long)(this->super_Gemm).A_data.w * (long)iVar36 *
                                      (this->super_Gemm).A_data.elemsize);
                            iVar8 = iVar19;
                            do {
                              *puVar25 = *puVar30;
                              puVar25 = puVar25 + 1;
                              puVar30 = puVar30 + lVar33;
                              iVar8 = iVar8 + -1;
                            } while (iVar8 != 0);
                          }
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar5);
                      }
                    }
                    else {
                      transpose_pack_A_tile_int8_avx2(A,(Mat *)local_128,iVar16,uVar5,iVar36,iVar19)
                      ;
                    }
                  }
                  else {
                    transpose_pack_A_tile_int8_avxvnni
                              (A,(Mat *)local_128,iVar16,uVar5,iVar36,iVar19);
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avxvnniint8
                            (A,(Mat *)local_128,iVar16,uVar5,iVar36,iVar19);
                }
              }
              piVar12 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
              if (piVar12 != (int *)0x0) {
                LOCK();
                *piVar12 = *piVar12 + -1;
                UNLOCK();
                if (*piVar12 == 0) {
                  if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
                    if ((undefined1 *)local_128._0_8_ != (undefined1 *)0x0) {
                      free((void *)local_128._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_128._32_8_)[3])();
                  }
                }
              }
              local_e8 = 0;
              local_128._0_8_ = (void *)0x0;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._16_8_ = 0;
              local_128._24_4_ = 0;
              stack0xffffffffffffff00 = (undefined1  [16])0x0;
              local_f0 = 0;
              iVar36 = iVar36 + TILE_K;
            } while (iVar36 < (int)uVar15);
          }
          uVar9 = (int)local_170 + 1;
          local_170 = (ulong)uVar9;
        } while (uVar9 != uVar7);
      }
      if (local_138->lightmode != false) {
        piVar12 = (this->super_Gemm).A_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar2 = (this->super_Gemm).A_data.data;
            pAVar3 = (this->super_Gemm).A_data.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      if ((char)local_144 != '\0') {
        return -100;
      }
      goto LAB_0050dad5;
    }
LAB_0050dbb8:
    iVar16 = -100;
  }
  return iVar16;
}

Assistant:

int Gemm_x86_avx::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}